

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseStatement(ParseContext *ctx)

{
  SynBase *node_16;
  SynBase *node_15;
  SynBase *node_14;
  SynBase *node_13;
  SynBase *node_12;
  SynBase *node_11;
  SynBase *node_10;
  SynBase *node_9;
  SynBase *node_8;
  SynBase *node_7;
  SynBase *node_6;
  SynBase *node_5;
  SynBase *node_4;
  SynBase *node_3;
  SynBase *node_2;
  SynBase *node_1;
  SynBase *node;
  ParseContext *ctx_local;
  
  ctx_local = (ParseContext *)ParseClassDefinition(ctx);
  if (((((((ctx_local == (ParseContext *)0x0) &&
          (ctx_local = (ParseContext *)ParseEnumDefinition(ctx), ctx_local == (ParseContext *)0x0))
         && (ctx_local = (ParseContext *)ParseNamespaceDefinition(ctx),
            ctx_local == (ParseContext *)0x0)) &&
        ((ctx_local = (ParseContext *)ParseReturn(ctx), ctx_local == (ParseContext *)0x0 &&
         (ctx_local = (ParseContext *)ParseYield(ctx), ctx_local == (ParseContext *)0x0)))) &&
       ((ctx_local = (ParseContext *)ParseBreak(ctx), ctx_local == (ParseContext *)0x0 &&
        ((ctx_local = (ParseContext *)ParseContinue(ctx), ctx_local == (ParseContext *)0x0 &&
         (ctx_local = (ParseContext *)ParseTypedef(ctx), ctx_local == (ParseContext *)0x0)))))) &&
      (ctx_local = (ParseContext *)ParseBlock(ctx), ctx_local == (ParseContext *)0x0)) &&
     ((((ctx_local = (ParseContext *)ParseIfElse(ctx,false), ctx_local == (ParseContext *)0x0 &&
        (ctx_local = (ParseContext *)ParseForEach(ctx), ctx_local == (ParseContext *)0x0)) &&
       (ctx_local = (ParseContext *)ParseFor(ctx), ctx_local == (ParseContext *)0x0)) &&
      (((ctx_local = (ParseContext *)ParseWhile(ctx), ctx_local == (ParseContext *)0x0 &&
        (ctx_local = (ParseContext *)ParseDoWhile(ctx), ctx_local == (ParseContext *)0x0)) &&
       ((ctx_local = (ParseContext *)ParseSwitch(ctx), ctx_local == (ParseContext *)0x0 &&
        ((ctx_local = (ParseContext *)ParseFunctionDefinition(ctx), ctx_local == (ParseContext *)0x0
         && (ctx_local = (ParseContext *)ParseVariableDefinitions(ctx,false),
            ctx_local == (ParseContext *)0x0)))))))))) {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseStatement(ParseContext &ctx)
{
	if(SynBase *node = ParseClassDefinition(ctx))
		return node;

	if(SynBase *node = ParseEnumDefinition(ctx))
		return node;

	if(SynBase *node = ParseNamespaceDefinition(ctx))
		return node;

	if(SynBase *node = ParseReturn(ctx))
		return node;

	if(SynBase *node = ParseYield(ctx))
		return node;

	if(SynBase *node = ParseBreak(ctx))
		return node;

	if(SynBase *node = ParseContinue(ctx))
		return node;

	if(SynBase *node = ParseTypedef(ctx))
		return node;

	if(SynBase *node = ParseBlock(ctx))
		return node;

	if(SynBase *node = ParseIfElse(ctx, false))
		return node;

	if(SynBase *node = ParseForEach(ctx))
		return node;

	if(SynBase *node = ParseFor(ctx))
		return node;

	if(SynBase *node = ParseWhile(ctx))
		return node;

	if(SynBase *node = ParseDoWhile(ctx))
		return node;

	if(SynBase *node = ParseSwitch(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseVariableDefinitions(ctx, false))
		return node;

	return NULL;
}